

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimingControl.cpp
# Opt level: O3

TimingControl *
slang::ast::SignalEventControl::fromExpr
          (Compilation *compilation,EdgeKind edge,Expression *expr,Expression *iffCondition,
          ASTContext *context,SourceRange sourceRange)

{
  Type *pTVar1;
  bool bVar2;
  bool bVar3;
  bitwidth_t bVar4;
  SignalEventControl *pSVar5;
  Symbol *pSVar6;
  Diagnostic *pDVar7;
  Type *pTVar8;
  TimingControl *pTVar9;
  InvalidTimingControl *pIVar10;
  SourceLocation SVar11;
  TimingControl *extraout_RDX;
  TimingControl *extraout_RDX_00;
  TimingControl *extraout_RDX_01;
  TimingControl *extraout_RDX_02;
  TimingControl *extraout_RDX_03;
  TimingControl *extraout_RDX_04;
  DiagCode code;
  ClockingEventExpression *cee;
  SourceRange sourceRange_00;
  EdgeKind local_64;
  Expression *local_60;
  _Variadic_union<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  char local_38;
  SourceLocation SVar12;
  
  local_64 = edge;
  local_60 = iffCondition;
  pSVar5 = BumpAllocator::
           emplace<slang::ast::SignalEventControl,slang::ast::EdgeKind&,slang::ast::Expression_const&,slang::ast::Expression_const*&,slang::SourceRange&>
                     (&compilation->super_BumpAllocator,&local_64,expr,&local_60,&sourceRange);
  bVar2 = Expression::bad(expr);
  if (bVar2) goto LAB_0034a210;
  pSVar6 = Expression::getSymbolReference(expr,true);
  if ((pSVar6 == (Symbol *)0x0) || (bVar2 = true, pSVar6->kind != ClockingBlock)) {
    bVar2 = expr->kind == ClockingEvent;
  }
  pTVar1 = (expr->type).ptr;
  if (local_64 == None) {
    bVar3 = Type::isAggregate(pTVar1);
    if (!bVar3) {
      pTVar1 = (expr->type).ptr;
      pTVar8 = pTVar1->canonical;
      pTVar9 = extraout_RDX_01;
      if (pTVar8 == (Type *)0x0) {
        Type::resolveCanonical(pTVar1);
        pTVar8 = pTVar1->canonical;
        pTVar9 = extraout_RDX_02;
      }
      if ((pTVar8->super_Symbol).kind != PropertyType) {
        pTVar1 = (expr->type).ptr;
        pTVar8 = pTVar1->canonical;
        if (pTVar8 == (Type *)0x0) {
          Type::resolveCanonical(pTVar1);
          pTVar8 = pTVar1->canonical;
          pTVar9 = extraout_RDX_03;
        }
        if ((bool)((pTVar8->super_Symbol).kind != VoidType | bVar2)) goto LAB_0034a183;
      }
    }
    SVar12 = (expr->sourceRange).startLoc;
    SVar11 = (expr->sourceRange).endLoc;
    code.subsystem = Statements;
    code.code = 0x24;
  }
  else {
    bVar3 = Type::isIntegral(pTVar1);
    if (bVar3) {
      bVar4 = Type::getBitWidth((expr->type).ptr);
      pTVar9 = extraout_RDX;
      if (1 < bVar4) {
        pDVar7 = ASTContext::addDiag(context,(DiagCode)0x5b0008,expr->sourceRange);
        ast::operator<<(pDVar7,(expr->type).ptr);
        pTVar9 = extraout_RDX_00;
      }
LAB_0034a183:
      if (local_60 == (Expression *)0x0) {
LAB_0034a1b8:
        if (expr->kind == ClockingEvent) {
          pTVar9 = cloneClockingEvent((ast *)compilation,*(Compilation **)(expr + 1),pTVar9);
          return pTVar9;
        }
        ASTContext::tryEval((ConstantValue *)&local_58,context,expr);
        std::__detail::__variant::
        _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
        ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)&local_58);
        if (local_38 == '\0') {
          return &pSVar5->super_TimingControl;
        }
        ASTContext::addDiag(context,(DiagCode)0x5a0008,expr->sourceRange);
        return &pSVar5->super_TimingControl;
      }
      if (bVar2) {
        ASTContext::addDiag(context,(DiagCode)0xd0008,local_60->sourceRange);
      }
      bVar2 = ASTContext::requireBooleanConvertible(context,local_60);
      pTVar9 = extraout_RDX_04;
      if (bVar2) goto LAB_0034a1b8;
      goto LAB_0034a210;
    }
    SVar12 = (expr->sourceRange).startLoc;
    SVar11 = (expr->sourceRange).endLoc;
    if (bVar2) {
      ASTContext::addDiag(context,(DiagCode)0xc0008,expr->sourceRange);
      goto LAB_0034a210;
    }
    code.subsystem = Expressions;
    code.code = 0x55;
  }
  sourceRange_00.endLoc = SVar11;
  sourceRange_00.startLoc = SVar12;
  pDVar7 = ASTContext::addDiag(context,code,sourceRange_00);
  ast::operator<<(pDVar7,(expr->type).ptr);
LAB_0034a210:
  local_58._0_8_ = pSVar5;
  pIVar10 = BumpAllocator::
            emplace<slang::ast::InvalidTimingControl,slang::ast::TimingControl_const*&>
                      (&compilation->super_BumpAllocator,(TimingControl **)&local_58);
  return &pIVar10->super_TimingControl;
}

Assistant:

TimingControl& SignalEventControl::fromExpr(Compilation& compilation, EdgeKind edge,
                                            const Expression& expr, const Expression* iffCondition,
                                            const ASTContext& context, SourceRange sourceRange) {
    auto result = compilation.emplace<SignalEventControl>(edge, expr, iffCondition, sourceRange);
    if (expr.bad())
        return badCtrl(compilation, result);

    // Note: `expr` here can be a void-typed ArbitrarySymbolExpression if it's
    // referring to a clocking block.
    auto symRef = expr.getSymbolReference();
    const bool isClocking = (symRef && symRef->kind == SymbolKind::ClockingBlock) ||
                            expr.kind == ExpressionKind::ClockingEvent;

    if (edge == EdgeKind::None) {
        if (expr.type->isAggregate() || expr.type->isPropertyType() ||
            (expr.type->isVoid() && !isClocking)) {
            context.addDiag(diag::InvalidEventExpression, expr.sourceRange) << *expr.type;
            return badCtrl(compilation, result);
        }
    }
    else if (!expr.type->isIntegral()) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventEdge, expr.sourceRange);
        else
            context.addDiag(diag::ExprMustBeIntegral, expr.sourceRange) << *expr.type;
        return badCtrl(compilation, result);
    }
    else if (expr.type->getBitWidth() > 1) {
        context.addDiag(diag::MultiBitEdge, expr.sourceRange) << *expr.type;
    }

    if (iffCondition) {
        if (isClocking)
            context.addDiag(diag::ClockingBlockEventIff, iffCondition->sourceRange);

        if (!context.requireBooleanConvertible(*iffCondition))
            return badCtrl(compilation, result);
    }

    // If our expression is a reference to another clocking event due to
    // a sequence or property argument expansion we need to unwrap to the
    // target timing control and use that instead.
    if (expr.kind == ExpressionKind::ClockingEvent) {
        auto& cee = expr.as<ClockingEventExpression>();
        return cloneClockingEvent(compilation, cee.timingControl);
    }

    // Warn if the expression is constant, since it'll never change to trigger off.
    if (context.tryEval(expr))
        context.addDiag(diag::EventExpressionConstant, expr.sourceRange);

    return *result;
}